

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

ZSTD_nextInputType_e ZSTD_nextInputType(ZSTD_DCtx *dctx)

{
  ZSTD_nextInputType_e ZVar1;
  uint uVar2;
  
  uVar2 = dctx->stage - ZSTDds_decodeBlockHeader;
  ZVar1 = ZSTDnit_frameHeader;
  if (uVar2 < 6) {
    ZVar1 = *(ZSTD_nextInputType_e *)(&DAT_0027d56c + (ulong)uVar2 * 4);
  }
  return ZVar1;
}

Assistant:

ZSTD_nextInputType_e ZSTD_nextInputType(ZSTD_DCtx* dctx) {
    switch(dctx->stage)
    {
    default:   /* should not happen */
        assert(0);
    case ZSTDds_getFrameHeaderSize:
    case ZSTDds_decodeFrameHeader:
        return ZSTDnit_frameHeader;
    case ZSTDds_decodeBlockHeader:
        return ZSTDnit_blockHeader;
    case ZSTDds_decompressBlock:
        return ZSTDnit_block;
    case ZSTDds_decompressLastBlock:
        return ZSTDnit_lastBlock;
    case ZSTDds_checkChecksum:
        return ZSTDnit_checksum;
    case ZSTDds_decodeSkippableHeader:
    case ZSTDds_skipFrame:
        return ZSTDnit_skippableFrame;
    }
}